

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

string_view __thiscall
bloaty::anon_unknown_0::ElfFile::GetRegion(ElfFile *this,uint64_t start,uint64_t n)

{
  ulong in_RCX;
  ulong uVar1;
  string_view sVar2;
  
  if (CARRY8(in_RCX,n)) {
    Throw("integer overflow in addition",0x4b);
  }
  if ((ElfFile *)(in_RCX + n) <= this) {
    uVar1 = (long)this - n;
    if (in_RCX <= (long)this - n) {
      uVar1 = in_RCX;
    }
    sVar2._M_str = (char *)(start + n);
    sVar2._M_len = uVar1;
    return sVar2;
  }
  Throw("region out-of-bounds",0x5d);
}

Assistant:

string_view GetRegion(uint64_t start, uint64_t n) const {
    return StrictSubstr(data_, start, n);
  }